

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::setProperties(FederateState *this,ActionMessage *cmd)

{
  uint uVar1;
  
  uVar1 = cmd->messageAction + 0xffffff36;
  if ((this->state)._M_i == CREATED) {
    switch(uVar1) {
    case 0:
      spinlock(this);
      setProperty(this,cmd->messageID,(Time)(cmd->actionTime).internalTimeCode);
      break;
    case 1:
      spinlock(this);
      setProperty(this,cmd->messageID,(cmd->dest_handle).hid);
      break;
    case 2:
      spinlock(this);
      setOptionFlag(this,cmd->messageID,SUB41((cmd->flags & 0x20) >> 5,0));
      break;
    default:
      goto switchD_00274bf8_caseD_3;
    case 7:
      spinlock(this);
      setInterfaceProperty(this,cmd);
    }
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
  else if ((uVar1 < 8) && ((0x87U >> (uVar1 & 0x1f) & 1) != 0)) {
    addAction(this,cmd);
    return;
  }
switchD_00274bf8_caseD_3:
  return;
}

Assistant:

void FederateState::setProperties(const ActionMessage& cmd)
{
    if (state == FederateStates::CREATED) {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
                spinlock();
                setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
                unlock();
                break;
            case CMD_FED_CONFIGURE_TIME:
                spinlock();
                setProperty(cmd.messageID, cmd.actionTime);
                unlock();
                break;
            case CMD_FED_CONFIGURE_INT:
                spinlock();
                setProperty(cmd.messageID, cmd.getExtraData());
                unlock();
                break;
            case CMD_INTERFACE_CONFIGURE:
                spinlock();
                setInterfaceProperty(cmd);
                unlock();
                break;
            default:
                break;
        }
    } else {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
            case CMD_FED_CONFIGURE_TIME:
            case CMD_FED_CONFIGURE_INT:
            case CMD_INTERFACE_CONFIGURE:
                addAction(cmd);
                break;
            default:
                break;
        }
    }
}